

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_byte_array_len_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  ulong uVar1;
  cram_codec *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t __n;
  uchar *puVar7;
  cram_block *b_00;
  cram_block *b_01;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  
  if (prefix == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(prefix);
    while( true ) {
      uVar1 = b->alloc;
      if (b->byte + __n < uVar1) break;
      auVar11._8_4_ = (int)(uVar1 >> 0x20);
      auVar11._0_8_ = uVar1;
      auVar11._12_4_ = 0x45300000;
      dVar14 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
      uVar8 = (ulong)dVar14;
      sVar9 = (long)(dVar14 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
      if (uVar1 == 0) {
        sVar9 = 0x400;
      }
      b->alloc = sVar9;
      puVar7 = (uchar *)realloc(b->data,sVar9);
      b->data = puVar7;
    }
    memcpy(b->data + b->byte,prefix,__n);
    b->byte = b->byte + __n;
  }
  pcVar2 = (c->field_6).e_byte_array_len.len_codec;
  b_00 = cram_new_block(FILE_HEADER,0);
  iVar3 = (*pcVar2->store)(pcVar2,b_00,(char *)0x0,version);
  pcVar2 = (c->field_6).e_byte_array_len.val_codec;
  b_01 = cram_new_block(FILE_HEADER,0);
  iVar4 = (*pcVar2->store)(pcVar2,b_01,(char *)0x0,version);
  iVar5 = itf8_put_blk(b,c->codec);
  iVar6 = itf8_put_blk(b,iVar4 + iVar3);
  while( true ) {
    uVar1 = b->alloc;
    if (b_00->byte + b->byte < uVar1) break;
    auVar12._8_4_ = (int)(uVar1 >> 0x20);
    auVar12._0_8_ = uVar1;
    auVar12._12_4_ = 0x45300000;
    dVar14 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
    uVar8 = (ulong)dVar14;
    sVar9 = (long)(dVar14 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
    if (uVar1 == 0) {
      sVar9 = 0x400;
    }
    b->alloc = sVar9;
    puVar7 = (uchar *)realloc(b->data,sVar9);
    b->data = puVar7;
  }
  memcpy(b->data + b->byte,b_00->data,b_00->byte);
  sVar10 = b->byte + b_00->byte;
  b->byte = sVar10;
  while( true ) {
    uVar1 = b->alloc;
    if (b_01->byte + sVar10 < uVar1) break;
    auVar13._8_4_ = (int)(uVar1 >> 0x20);
    auVar13._0_8_ = uVar1;
    auVar13._12_4_ = 0x45300000;
    dVar14 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
    uVar8 = (ulong)dVar14;
    sVar9 = (long)(dVar14 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
    if (uVar1 == 0) {
      sVar9 = 0x400;
    }
    b->alloc = sVar9;
    puVar7 = (uchar *)realloc(b->data,sVar9);
    b->data = puVar7;
    sVar10 = b->byte;
  }
  memcpy(b->data + sVar10,b_01->data,b_01->byte);
  b->byte = b->byte + b_01->byte;
  cram_free_block(b_00);
  cram_free_block(b_01);
  return iVar5 + iVar6 + iVar4 + iVar3 + (int)__n;
}

Assistant:

int cram_byte_array_len_encode_store(cram_codec *c, cram_block *b,
				     char *prefix, int version) {
    int len = 0, len2, len3;
    cram_codec *tc;
    cram_block *b_len, *b_val;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    tc = c->e_byte_array_len.len_codec; 
    b_len = cram_new_block(0, 0);
    len2 = tc->store(tc, b_len, NULL, version);

    tc = c->e_byte_array_len.val_codec;
    b_val = cram_new_block(0, 0);
    len3 = tc->store(tc, b_val, NULL, version);

    len += itf8_put_blk(b, c->codec);
    len += itf8_put_blk(b, len2+len3);
    BLOCK_APPEND(b, BLOCK_DATA(b_len), BLOCK_SIZE(b_len));
    BLOCK_APPEND(b, BLOCK_DATA(b_val), BLOCK_SIZE(b_val));

    cram_free_block(b_len);
    cram_free_block(b_val);

    return len + len2 + len3;
}